

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

void __thiscall
spirv_cross::SmallVector<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>,_8UL>::reserve
          (SmallVector<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>,_8UL> *this,size_t count
          )

{
  undefined8 *puVar1;
  char *pcVar2;
  undefined8 uVar3;
  ulong uVar4;
  pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn> *ppVar5;
  long lVar6;
  size_t i;
  ulong uVar7;
  pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn> *__ptr;
  
  if (count >> 0x3c == 0) {
    uVar4 = this->buffer_capacity;
    if (uVar4 < count) {
      uVar7 = 8;
      if (8 < uVar4) {
        uVar7 = uVar4;
      }
      do {
        uVar4 = uVar7;
        uVar7 = uVar4 * 2;
      } while (uVar4 < count);
      if (uVar4 < 9) {
        ppVar5 = (pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn> *)&this->stack_storage;
      }
      else {
        ppVar5 = (pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn> *)malloc(uVar4 << 4);
        if (ppVar5 == (pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn> *)0x0) goto LAB_0023a286;
      }
      __ptr = (this->super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>).ptr;
      if (ppVar5 != __ptr) {
        lVar6 = 0;
        for (uVar7 = 0;
            uVar7 < (this->super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>).
                    buffer_size; uVar7 = uVar7 + 1) {
          puVar1 = (undefined8 *)
                   ((long)&((this->
                            super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>)
                           .ptr)->first + lVar6);
          uVar3 = puVar1[1];
          pcVar2 = (char *)((long)&ppVar5->first + lVar6);
          *(undefined8 *)pcVar2 = *puVar1;
          *(undefined8 *)(pcVar2 + 8) = uVar3;
          lVar6 = lVar6 + 0x10;
        }
        __ptr = (this->super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>).ptr;
      }
      if (__ptr != (pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn> *)&this->stack_storage) {
        free(__ptr);
      }
      (this->super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>).ptr = ppVar5;
      this->buffer_capacity = uVar4;
    }
    return;
  }
LAB_0023a286:
  ::std::terminate();
}

Assistant:

void reserve(size_t count) SPIRV_CROSS_NOEXCEPT
	{
		if ((count > (std::numeric_limits<size_t>::max)() / sizeof(T)) ||
		    (count > (std::numeric_limits<size_t>::max)() / 2))
		{
			// Only way this should ever happen is with garbage input, terminate.
			std::terminate();
		}

		if (count > buffer_capacity)
		{
			size_t target_capacity = buffer_capacity;
			if (target_capacity == 0)
				target_capacity = 1;

			// Weird parens works around macro issues on Windows if NOMINMAX is not used.
			target_capacity = (std::max)(target_capacity, N);

			// Need to ensure there is a POT value of target capacity which is larger than count,
			// otherwise this will overflow.
			while (target_capacity < count)
				target_capacity <<= 1u;

			T *new_buffer =
			    target_capacity > N ? static_cast<T *>(malloc(target_capacity * sizeof(T))) : stack_storage.data();

			// If we actually fail this malloc, we are hosed anyways, there is no reason to attempt recovery.
			if (!new_buffer)
				std::terminate();

			// In case for some reason two allocations both come from same stack.
			if (new_buffer != this->ptr)
			{
				// We don't deal with types which can throw in move constructor.
				for (size_t i = 0; i < this->buffer_size; i++)
				{
					new (&new_buffer[i]) T(std::move(this->ptr[i]));
					this->ptr[i].~T();
				}
			}

			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = new_buffer;
			buffer_capacity = target_capacity;
		}
	}